

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators,
          bool includeNamesWithPlatform)

{
  cmGlobalGeneratorFactory *pcVar1;
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pbVar2;
  int iVar3;
  undefined7 in_register_00000011;
  pointer ppcVar4;
  string *psVar5;
  string *a;
  undefined8 globalGenerator;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namesWithPlatform;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_160 [32];
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined2 local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  bool local_c0;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  string *local_70;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *local_68;
  undefined1 local_60 [32];
  cmake *local_40;
  pointer local_38;
  
  local_80 = (pointer)CONCAT44(local_80._4_4_,
                               (int)CONCAT71(in_register_00000011,includeNamesWithPlatform));
  ppcVar4 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->Generators).
             super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = generators;
  local_40 = this;
  if (ppcVar4 != local_38) {
    do {
      pcVar1 = *ppcVar4;
      (*pcVar1->_vptr_cmGlobalGeneratorFactory[4])
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                 pcVar1);
      if ((char)local_80 != '\0') {
        (*pcVar1->_vptr_cmGlobalGeneratorFactory[5])(local_160,pcVar1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                   local_60._8_8_,local_160._0_8_,local_160._8_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_160);
      }
      local_70 = (string *)local_60._8_8_;
      psVar5 = (string *)local_60._0_8_;
      local_78 = (pointer)ppcVar4;
      if (local_60._0_8_ != local_60._8_8_) {
        do {
          local_160._0_8_ = local_160 + 0x10;
          local_160._8_8_ = (pointer)0x0;
          local_160[0x10] = '\0';
          local_140._M_p = (pointer)&local_130;
          local_138 = 0;
          local_130._M_local_buf[0] = '\0';
          local_120._M_p = (pointer)&local_110;
          local_118 = 0;
          local_110._M_local_buf[0] = '\0';
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e0._M_p = (pointer)&local_d0;
          local_d8 = 0;
          local_d0._M_local_buf[0] = '\0';
          iVar3 = (*pcVar1->_vptr_cmGlobalGeneratorFactory[6])(pcVar1);
          local_100._0_1_ = SUB41(iVar3,0);
          iVar3 = (*pcVar1->_vptr_cmGlobalGeneratorFactory[7])(pcVar1);
          local_100._1_1_ = SUB41(iVar3,0);
          (*pcVar1->_vptr_cmGlobalGeneratorFactory[8])(&local_98,pcVar1);
          local_b8._16_8_ =
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_b8._8_8_ =
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_b8._0_8_ =
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._M_allocated_capacity;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
          local_98._M_allocated_capacity = 0;
          local_98._8_8_ = (string *)0x0;
          local_88 = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_98);
          (*pcVar1->_vptr_cmGlobalGeneratorFactory[9])((string *)local_b8,pcVar1);
          std::__cxx11::string::operator=((string *)&local_e0,(string *)local_b8);
          if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
          }
          std::__cxx11::string::_M_assign((string *)local_160);
          std::__cxx11::string::_M_assign((string *)(local_160 + 0x20));
          local_c0 = false;
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
          emplace_back<cmake::GeneratorInfo>(local_68,(GeneratorInfo *)local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_p != &local_d0) {
            operator_delete(local_e0._M_p,
                            CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0])
                            + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_p != &local_110) {
            operator_delete(local_120._M_p,
                            CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_p != &local_130) {
            operator_delete(local_140._M_p,
                            CONCAT71(local_130._M_allocated_capacity._1_7_,local_130._M_local_buf[0]
                                    ) + 1);
          }
          if ((pointer)local_160._0_8_ != (pointer)(local_160 + 0x10)) {
            operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
          }
          psVar5 = psVar5 + 1;
        } while (psVar5 != local_70);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
      ppcVar4 = (pointer)(local_78 + 1);
    } while (ppcVar4 != local_38);
  }
  local_78 = (local_40->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (local_40->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78 != local_80) {
    do {
      this_00 = *local_78;
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,this_00);
      local_70 = (string *)local_98._8_8_;
      globalGenerator = local_98._M_allocated_capacity;
      if (local_98._M_allocated_capacity != local_98._8_8_) {
        do {
          local_160._0_8_ = local_160 + 0x10;
          local_160._8_8_ = (pointer)0x0;
          local_160[0x10] = '\0';
          local_140._M_p = (pointer)&local_130;
          local_138 = 0;
          local_130._M_local_buf[0] = '\0';
          local_120._M_p = (pointer)&local_110;
          local_118 = 0;
          local_110._M_local_buf[0] = '\0';
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
          local_d8 = 0;
          local_d0._M_local_buf[0] = '\0';
          local_e0._M_p = (pointer)&local_d0;
          cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_((string *)local_60,this_00);
          cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                    ((string *)local_b8,(string *)globalGenerator,(string *)local_60);
          std::__cxx11::string::operator=((string *)local_160,(string *)local_b8);
          if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
          }
          if ((string *)local_60._0_8_ != (string *)(local_60 + 0x10)) {
            operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
          }
          std::__cxx11::string::_M_assign((string *)(local_160 + 0x20));
          cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_((string *)local_b8,this_00);
          std::__cxx11::string::operator=((string *)&local_120,(string *)local_b8);
          if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
          }
          local_100._0_1_ = false;
          local_100._1_1_ = false;
          local_c0 = false;
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
          emplace_back<cmake::GeneratorInfo>(local_68,(GeneratorInfo *)local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_p != &local_d0) {
            operator_delete(local_e0._M_p,
                            CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0])
                            + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_p != &local_110) {
            operator_delete(local_120._M_p,
                            CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_p != &local_130) {
            operator_delete(local_140._M_p,
                            CONCAT71(local_130._M_allocated_capacity._1_7_,local_130._M_local_buf[0]
                                    ) + 1);
          }
          if ((pointer)local_160._0_8_ != (pointer)(local_160 + 0x10)) {
            operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
          }
          globalGenerator = globalGenerator + 0x20;
        } while ((string *)globalGenerator != local_70);
      }
      pbVar2 = (this_00->Aliases).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (this_00->Aliases).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1
          ) {
        local_160._0_8_ = local_160 + 0x10;
        local_160._8_8_ = (pointer)0x0;
        local_160[0x10] = '\0';
        local_140._M_p = (pointer)&local_130;
        local_138 = 0;
        local_130._M_local_buf[0] = '\0';
        local_120._M_p = (pointer)&local_110;
        local_118 = 0;
        local_110._M_local_buf[0] = '\0';
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_d8 = 0;
        local_d0._M_local_buf[0] = '\0';
        local_e0._M_p = (pointer)&local_d0;
        std::__cxx11::string::_M_assign((string *)local_160);
        if (local_98._M_allocated_capacity != local_98._8_8_) {
          std::__cxx11::string::_M_assign((string *)(local_160 + 0x20));
        }
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_((string *)local_b8,this_00);
        std::__cxx11::string::operator=((string *)&local_120,(string *)local_b8);
        if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
        }
        local_100._0_1_ = false;
        local_100._1_1_ = false;
        local_c0 = true;
        std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
        emplace_back<cmake::GeneratorInfo>(local_68,(GeneratorInfo *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_p != &local_d0) {
          operator_delete(local_e0._M_p,
                          CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]) +
                          1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_p != &local_110) {
          operator_delete(local_120._M_p,
                          CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_p != &local_130) {
          operator_delete(local_140._M_p,
                          CONCAT71(local_130._M_allocated_capacity._1_7_,local_130._M_local_buf[0])
                          + 1);
        }
        if ((pointer)local_160._0_8_ != (pointer)(local_160 + 0x10)) {
          operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      local_78 = local_78 + 1;
    } while (local_78 != local_80);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(std::vector<GeneratorInfo>& generators,
                                    bool includeNamesWithPlatform) const
{
  for (cmGlobalGeneratorFactory* gen : this->Generators) {
    std::vector<std::string> names = gen->GetGeneratorNames();

    if (includeNamesWithPlatform) {
      std::vector<std::string> namesWithPlatform =
        gen->GetGeneratorNamesWithPlatform();
      names.insert(names.end(), namesWithPlatform.begin(),
                   namesWithPlatform.end());
    }

    for (std::string const& name : names) {
      GeneratorInfo info;
      info.supportsToolset = gen->SupportsToolset();
      info.supportsPlatform = gen->SupportsPlatform();
      info.supportedPlatforms = gen->GetKnownPlatforms();
      info.defaultPlatform = gen->GetDefaultPlatformName();
      info.name = name;
      info.baseName = name;
      info.isAlias = false;
      generators.push_back(std::move(info));
    }
  }

  for (cmExternalMakefileProjectGeneratorFactory* eg : this->ExtraGenerators) {
    const std::vector<std::string> genList =
      eg->GetSupportedGlobalGenerators();
    for (std::string const& gen : genList) {
      GeneratorInfo info;
      info.name = cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
        gen, eg->GetName());
      info.baseName = gen;
      info.extraName = eg->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = false;
      generators.push_back(std::move(info));
    }
    for (std::string const& a : eg->Aliases) {
      GeneratorInfo info;
      info.name = a;
      if (!genList.empty()) {
        info.baseName = genList.at(0);
      }
      info.extraName = eg->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = true;
      generators.push_back(std::move(info));
    }
  }
}